

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
UnscentedKalmanFilter::GenerateSigmaPoints
          (UnscentedKalmanFilter *this,VectorXd *x,MatrixXd *P,MatrixXd *Xsig)

{
  double *pdVar1;
  double *pdVar2;
  DenseIndex DVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  Index size_2;
  Index size_1;
  ulong uVar18;
  Index index_3;
  double *pdVar19;
  Index index_2;
  ulong uVar20;
  MatrixXd A;
  void *local_70;
  ulong local_68;
  long local_60;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *local_58;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_50;
  
  DVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT(&local_50,P);
  if (local_50.m_isInitialized == false) {
    __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Cholesky/LLT.h"
                  ,0x6a,
                  "typename Traits::MatrixL Eigen::LLT<Eigen::Matrix<double, -1, -1>>::matrixL() const [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                 );
  }
  local_58 = &local_50;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_70,
             (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
              *)&local_58);
  free(local_50.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  pdVar4 = (Xsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  uVar15 = (Xsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
  ;
  if ((long)uVar15 < 0 && pdVar4 != (double *)0x0) {
LAB_0011e636:
    __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                  ,0x94,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                 );
  }
  if ((Xsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols < 1)
  {
LAB_0011e655:
    __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                  ,0x76,
                  "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                 );
  }
  if (uVar15 == (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
     ) {
    uVar13 = (ulong)((uint)((ulong)pdVar4 >> 3) & 1);
    if ((long)uVar15 <= (long)uVar13) {
      uVar13 = uVar15;
    }
    if (((ulong)pdVar4 & 7) != 0) {
      uVar13 = uVar15;
    }
    lVar14 = uVar15 - uVar13;
    if (0 < (long)uVar13) {
      pdVar19 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar16 = 0;
      do {
        pdVar4[uVar16] = pdVar19[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
    }
    uVar16 = (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
    if (1 < lVar14) {
      do {
        pdVar19 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + uVar13;
        dVar5 = pdVar19[1];
        pdVar4[uVar13] = *pdVar19;
        (pdVar4 + uVar13)[1] = dVar5;
        uVar13 = uVar13 + 2;
      } while ((long)uVar13 < (long)uVar16);
    }
    if ((long)uVar16 < (long)uVar15) {
      pdVar19 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      do {
        pdVar4[uVar16] = pdVar19[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    dVar5 = (double)this->n_x_ + this->lambda_;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    uVar11 = (uint)DVar3;
    if (0 < (int)uVar11) {
      uVar13 = (ulong)(uVar11 & 0x7fffffff);
      lVar14 = uVar13 * 8;
      lVar8 = 8;
      lVar10 = 0;
      uVar15 = 0;
      do {
        lVar14 = lVar14 + 8;
        if (((long)local_68 < 0) &&
           ((void *)((long)local_70 + local_68 * uVar15 * 8) != (void *)0x0)) goto LAB_0011e636;
        if (local_60 <= (long)uVar15) goto LAB_0011e655;
        if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
            local_68) {
          pcVar9 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
          ;
LAB_0011e6d6:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                        ,0x84,pcVar9);
        }
        uVar16 = uVar15 + 1;
        pdVar4 = (Xsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        uVar18 = (Xsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
        pdVar19 = pdVar4 + uVar18 * uVar16;
        if ((long)uVar18 < 0 && pdVar19 != (double *)0x0) goto LAB_0011e636;
        if ((Xsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= (long)uVar16) goto LAB_0011e655;
        if (uVar18 != local_68) {
          pcVar9 = 
          "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
          ;
          goto LAB_0011e6b7;
        }
        uVar20 = (ulong)((uint)((ulong)pdVar19 >> 3) & 1);
        if ((long)uVar18 <= (long)uVar20) {
          uVar20 = uVar18;
        }
        if (((ulong)pdVar19 & 7) != 0) {
          uVar20 = uVar18;
        }
        if (0 < (long)uVar20) {
          pdVar19 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          uVar12 = 0;
          do {
            *(double *)((long)pdVar4 + uVar12 * 8 + uVar18 * lVar8) =
                 *(double *)((long)local_70 + uVar12 * 8 + local_68 * lVar10) * dVar5 +
                 pdVar19[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar20 != uVar12);
        }
        lVar17 = uVar18 - uVar20;
        uVar12 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar20;
        if (1 < lVar17) {
          do {
            pdVar19 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data + uVar20;
            dVar6 = pdVar19[1];
            pdVar1 = (double *)((long)local_70 + uVar20 * 8 + local_68 * lVar10);
            dVar7 = pdVar1[1];
            pdVar2 = (double *)((long)pdVar4 + uVar20 * 8 + uVar18 * lVar8);
            *pdVar2 = *pdVar1 * dVar5 + *pdVar19;
            pdVar2[1] = dVar7 * dVar5 + dVar6;
            uVar20 = uVar20 + 2;
          } while ((long)uVar20 < (long)uVar12);
        }
        if ((long)uVar12 < (long)uVar18) {
          pdVar19 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          do {
            *(double *)((long)pdVar4 + uVar12 * 8 + uVar18 * lVar8) =
                 *(double *)((long)local_70 + uVar12 * 8 + local_68 * lVar10) * dVar5 +
                 pdVar19[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar18 != uVar12);
        }
        if (((long)local_68 < 0) &&
           ((void *)((long)local_70 + local_68 * uVar15 * 8) != (void *)0x0)) goto LAB_0011e636;
        if (local_60 <= (long)uVar15) goto LAB_0011e655;
        if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
            local_68) {
          pcVar9 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
          ;
          goto LAB_0011e6d6;
        }
        lVar17 = uVar16 + uVar13;
        pdVar19 = (Xsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                  .m_data;
        uVar15 = (Xsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
        pdVar4 = pdVar19 + uVar15 * lVar17;
        if (((long)uVar15 < 0) && (pdVar4 != (double *)0x0)) goto LAB_0011e636;
        if (((int)lVar17 < 0) ||
           ((Xsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar17)) goto LAB_0011e655;
        if (uVar15 != local_68) {
          pcVar9 = 
          "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
          ;
          goto LAB_0011e6b7;
        }
        uVar18 = (ulong)((uint)((ulong)pdVar4 >> 3) & 1);
        if ((long)uVar15 <= (long)uVar18) {
          uVar18 = uVar15;
        }
        if (((ulong)pdVar4 & 7) != 0) {
          uVar18 = uVar15;
        }
        if (0 < (long)uVar18) {
          pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          uVar20 = 0;
          do {
            *(double *)((long)pdVar19 + uVar20 * 8 + uVar15 * lVar14) =
                 pdVar4[uVar20] -
                 *(double *)((long)local_70 + uVar20 * 8 + local_68 * lVar10) * dVar5;
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
        }
        lVar17 = uVar15 - uVar18;
        uVar20 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar18;
        if (1 < lVar17) {
          do {
            pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data + uVar18;
            dVar6 = pdVar4[1];
            pdVar2 = (double *)((long)local_70 + uVar18 * 8 + local_68 * lVar10);
            dVar7 = pdVar2[1];
            pdVar1 = (double *)((long)pdVar19 + uVar18 * 8 + uVar15 * lVar14);
            *pdVar1 = *pdVar4 - *pdVar2 * dVar5;
            pdVar1[1] = dVar6 - dVar7 * dVar5;
            uVar18 = uVar18 + 2;
          } while ((long)uVar18 < (long)uVar20);
        }
        if ((long)uVar20 < (long)uVar15) {
          pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          do {
            *(double *)((long)pdVar19 + uVar20 * 8 + uVar15 * lVar14) =
                 pdVar4[uVar20] -
                 *(double *)((long)local_70 + uVar20 * 8 + local_68 * lVar10) * dVar5;
            uVar20 = uVar20 + 1;
          } while (uVar15 != uVar20);
        }
        lVar8 = lVar8 + 8;
        lVar10 = lVar10 + 8;
        uVar15 = uVar16;
      } while (uVar16 != uVar13);
    }
    free(local_70);
    return;
  }
  pcVar9 = 
  "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_0011e6b7:
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                ,0x1f9,pcVar9);
}

Assistant:

void UnscentedKalmanFilter::GenerateSigmaPoints(const VectorXd &x, const MatrixXd &P, MatrixXd &Xsig) const {

    int n_x = x.rows();

    // calculate square root of P
    MatrixXd A = P.llt().matrixL();

    //set first column of sigma point matrix
    Xsig.col(0)  = x;

    double s = sqrt(lambda_+n_x_);

    // set remaining sigma points
    for (int i = 0; i < n_x; i++) {
	Xsig.col(i+1)     = x + s * A.col(i);
        Xsig.col(i+1+n_x) = x - s * A.col(i);
    }
}